

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

commonNaNT * float128ToCommonNaN(commonNaNT *__return_storage_ptr__,float128 a,float_status *status)

{
  ulong uVar1;
  
  uVar1 = a.low;
  if (((a.high & 0x7fff800000000000) == 0x7fff000000000000) &&
     (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
      uVar1 != 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  __return_storage_ptr__->sign = a.high._7_1_ >> 7;
  __return_storage_ptr__->low = uVar1 << 0x10;
  __return_storage_ptr__->high = a.high << 0x10 | uVar1 >> 0x30;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float128ToCommonNaN(float128 a, float_status *status)
{
    commonNaNT z;

    if (float128_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = a.high >> 63;
    shortShift128Left(a.high, a.low, 16, &z.high, &z.low);
    return z;
}